

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_102615::DiskInterfaceTestStatBadPath::Run(DiskInterfaceTestStatBadPath *this)

{
  Test *pTVar1;
  int iVar2;
  TimeStamp TVar3;
  string too_long_name;
  string err;
  string local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\0');
  pTVar1 = g_current_test;
  TVar3 = RealDiskInterface::Stat(&(this->super_DiskInterfaceTest).disk_,&local_68,&local_48);
  testing::Test::Check
            (pTVar1,TVar3 == -1,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x4c,"-1 == disk_.Stat(too_long_name, &err)");
  pTVar1 = g_current_test;
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  testing::Test::Check
            (pTVar1,iVar2 != 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x4d,"\"\" != err");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}